

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

void Map_MappingEstimateRefsInit(Map_Man_t *p)

{
  int iVar1;
  Map_NodeVec_t *pMVar2;
  Map_Node_t *pMVar3;
  long lVar4;
  float fVar5;
  
  pMVar2 = p->vMapObjs;
  iVar1 = pMVar2->nSize;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pMVar3 = pMVar2->pArray[lVar4];
    fVar5 = (float)pMVar3->nRefs;
    pMVar3->nRefEst[2] = fVar5;
    pMVar3->nRefEst[1] = fVar5;
    pMVar3->nRefEst[0] = fVar5;
  }
  return;
}

Assistant:

void Map_MappingEstimateRefsInit( Map_Man_t * p )
{
    Map_Node_t * pNode;
    int i;
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
//        pNode->nRefEst[0] = pNode->nRefEst[1] = ((float)pNode->nRefs)*(float)2.0;
        pNode->nRefEst[0] = pNode->nRefEst[1] = pNode->nRefEst[2] = ((float)pNode->nRefs);
    }
}